

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportInstallFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  pointer pcVar1;
  long *plVar2;
  bool bVar3;
  undefined8 uVar4;
  bool bVar5;
  cmake *cmakeInstance;
  mapped_type *ppcVar6;
  string *psVar7;
  ostream *poVar8;
  WrapQuotes wrapQuotes;
  pointer config;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string_view str;
  string_view separator;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string dest;
  string unescapedDest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmGeneratorExpression ge;
  ostringstream e;
  undefined1 local_320 [16];
  string local_310;
  string local_2f0;
  string local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  cmMakefile *local_250;
  cmExportInstallFileGenerator *local_248;
  string *local_240;
  string local_238;
  long *local_218 [2];
  long local_208 [2];
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [8];
  char *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  size_type local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  undefined8 local_188;
  undefined8 local_180;
  char *local_178;
  undefined8 local_170 [33];
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  char local_50 [32];
  
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_320._8_8_ = fileSet;
  local_248 = this;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_280,gte->Makefile,IncludeEmptyConfig);
  cmakeInstance = cmMakefile::GetCMakeInstance(gte->Makefile);
  local_268.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_268.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_268);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_1f8,cmakeInstance,(cmListFileBacktrace *)&local_268);
  if (local_268.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ppcVar6 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,(key_type *)(local_320 + 8));
  pcVar1 = ((*ppcVar6)->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_218,pcVar1,
             pcVar1 + ((*ppcVar6)->super_cmInstallGenerator).Destination._M_string_length);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_320,(string *)local_1f8);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  local_240 = local_280.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_280.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_280.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_258 = &__return_storage_ptr__->field_2;
    config = local_280.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_1e0 = (undefined1  [8])&local_1d0;
      local_1d8 = (char *)0x0;
      local_1d0._M_allocated_capacity = local_1d0._M_allocated_capacity & 0xffffffffffffff00;
      wrapQuotes = Wrap;
      psVar7 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_320._0_8_,gte->LocalGenerator,
                          config,gte,(cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0
                          ,(string *)local_1e0);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      pcVar1 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,pcVar1,pcVar1 + psVar7->_M_string_length);
      if (local_1e0 != (undefined1  [8])&local_1d0) {
        operator_delete((void *)local_1e0,local_1d0._M_allocated_capacity + 1);
      }
      str._M_str = (char *)0x1;
      str._M_len = (size_t)local_2b8._M_dataplus._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)(local_320 + 0x10),(cmOutputConverter *)local_2b8._M_string_length,str,
                 wrapQuotes);
      bVar5 = cmsys::SystemTools::FileIsFullPath(&local_2b8);
      if (!bVar5) {
        local_1e0 = (undefined1  [8])0x12;
        local_1d8 = "${_IMPORT_PREFIX}/";
        local_1d0._M_allocated_capacity = 0;
        local_1d0._8_8_ = local_310._M_string_length;
        local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._M_dataplus._M_p;
        local_1b8 = 0;
        views._M_len = 2;
        views._M_array = (iterator)local_1e0;
        cmCatViews(&local_2f0,views);
        std::__cxx11::string::operator=((string *)(local_320 + 0x10),(string *)&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,
                          (ulong)(local_2f0.field_2._M_allocated_capacity + 1));
        }
      }
      uVar4 = local_320._8_8_;
      if (*(bool *)(local_320._0_8_ + 0x130) == true) {
        if ((((string *)(local_320._8_8_ + 0x28))->_M_string_length == 0xb) &&
           (plVar2 = (long *)(((string *)(local_320._8_8_ + 0x28))->_M_dataplus)._M_p,
           *(long *)((long)plVar2 + 3) == 0x53454c55444f4d5f && *plVar2 == 0x55444f4d5f585843)) {
          local_250 = local_248->IEGen->LocalGenerator->Makefile;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"The \"",5);
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(gte);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1e0,(psVar7->_M_dataplus)._M_p,
                              psVar7->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" target\'s interface file set \"",0x1f);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(((string *)(local_320._8_8_ + 8))->_M_dataplus)._M_p,
                              ((string *)(local_320._8_8_ + 8))->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" of type \"",0xb);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(((string *)(uVar4 + 0x28))->_M_dataplus)._M_p,
                              ((string *)(uVar4 + 0x28))->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "\" contains context-sensitive base file entries which is not supported.",0x46)
          ;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(local_250,FATAL_ERROR,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,
                            (ulong)(local_2f0.field_2._M_allocated_capacity + 1));
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_258;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
          std::ios_base::~ios_base((ios_base *)local_170);
          bVar5 = false;
        }
        else {
          if ((long)local_280.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_280.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x20) goto LAB_005dc7cc;
          local_1e0 = (undefined1  [8])0xc;
          local_1d8 = "\"$<$<CONFIG:";
          local_1d0._M_allocated_capacity = 0;
          local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(config->_M_dataplus)._M_p;
          local_1d0._8_8_ = config->_M_string_length;
          local_1b8 = 0;
          local_1b0 = 2;
          local_1a8 = ">:";
          local_1a0 = 0;
          local_198 = local_310._M_string_length;
          local_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._M_dataplus._M_p;
          local_188 = 0;
          local_180 = 2;
          local_178 = ">\"";
          local_170[0] = 0;
          views_01._M_len = 5;
          views_01._M_array = (iterator)local_1e0;
          cmCatViews(&local_2f0,views_01);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298
                     ,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,
                            (ulong)(local_2f0.field_2._M_allocated_capacity + 1));
          }
          bVar5 = true;
        }
        bVar3 = false;
      }
      else {
LAB_005dc7cc:
        local_2f0._M_dataplus._M_p = (pointer)0x0;
        local_2f0._M_string_length = 1;
        local_2f0.field_2._M_allocated_capacity = (long)&local_2f0.field_2 + 8;
        local_2f0.field_2._M_local_buf[8] = '\"';
        local_1e0 = (undefined1  [8])0x1;
        local_1d0._M_allocated_capacity = 0;
        local_1d0._8_8_ = local_310._M_string_length;
        local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_310._M_dataplus._M_p;
        local_1b8 = 0;
        local_68 = 0;
        local_60 = 1;
        local_1a8 = local_50;
        local_50[0] = '\"';
        local_1b0 = 1;
        local_1a0 = 0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_1e0;
        local_1d8 = (char *)local_2f0.field_2._M_allocated_capacity;
        local_58 = local_1a8;
        cmCatViews(&local_238,views_00);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
                   &local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        bVar3 = true;
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) {
        if (!bVar3) goto LAB_005dcb7f;
        break;
      }
      config = config + 1;
    } while (config != local_240);
  }
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(__return_storage_ptr__,&local_298,separator,(string_view)ZEXT816(0));
LAB_005dcb7f:
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_320);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  cmGeneratorExpression ge(*gte->Makefile->GetCMakeInstance());
  auto cge = ge.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto unescapedDest = cge->Evaluate(gte->LocalGenerator, config, gte);
    auto dest = cmOutputConverter::EscapeForCMake(
      unescapedDest, cmOutputConverter::WrapQuotes::NoWrap);
    if (!cmSystemTools::FileIsFullPath(unescapedDest)) {
      dest = cmStrCat("${_IMPORT_PREFIX}/", dest);
    }

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (cge->GetHadContextSensitiveCondition() && type == "CXX_MODULES"_s) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    if (cge->GetHadContextSensitiveCondition() && configs.size() != 1) {
      resultVector.push_back(
        cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
    } else {
      resultVector.emplace_back(cmStrCat('"', dest, '"'));
      break;
    }
  }

  return cmJoin(resultVector, " ");
}